

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O3

QString * __thiscall
CsvModelSerialiserPrivate::escapedCSV
          (QString *__return_storage_ptr__,CsvModelSerialiserPrivate *this,QString *unexc)

{
  Data *pDVar1;
  char16_t *pcVar2;
  long lVar3;
  QLatin1Char local_4a;
  QLatin1Char local_49;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  QStringBuilder<QLatin1Char,_QString> local_30;
  QStringBuilder<QStringBuilder<QLatin1Char,_QString>,_QLatin1Char> local_20;
  
  lVar3 = QString::indexOf(unexc,(longlong)&this->m_csvSeparator,CaseInsensitive);
  if (lVar3 == -1) {
    pDVar1 = (unexc->d).d;
    pcVar2 = (unexc->d).ptr;
    (unexc->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    (unexc->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = (unexc->d).size;
    (unexc->d).size = 0;
  }
  else {
    local_4a.ch = '\"';
    local_48 = (QArrayData *)0x0;
    local_40 = L"\"\"";
    local_38 = 2;
    local_30.b = (QString *)
                 QString::replace((QChar)(char16_t)unexc,(QString *)0x22,(CaseSensitivity)&local_48)
    ;
    local_30.a = &local_4a;
    local_20.a = &local_30;
    local_20.b = &local_49;
    local_49.ch = '\"';
    QStringBuilder<QStringBuilder<QLatin1Char,_QString>,_QLatin1Char>::convertTo<QString>
              (__return_storage_ptr__,&local_20);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString CsvModelSerialiserPrivate::escapedCSV(QString unexc) const
{
    if (!unexc.contains(m_csvSeparator))
        return unexc;
    return QLatin1Char('\"') % unexc.replace(QLatin1Char('\"'), QStringLiteral("\"\"")) % QLatin1Char('\"');
}